

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  char *__s;
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_69;
  string local_68;
  XmlEncode local_48;
  char *local_20;
  char *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  local_20 = attribute;
  attribute_local = (char *)name;
  name_local = (string *)this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (name);
  if (((!bVar1) && (local_20 != (char *)0x0)) && (*local_20 != '\0')) {
    poVar2 = std::operator<<(this->m_os,' ');
    poVar2 = std::operator<<(poVar2,(string *)attribute_local);
    poVar2 = std::operator<<(poVar2,"=\"");
    __s = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
    XmlEncode::XmlEncode(&local_48,&local_68,ForAttributes);
    poVar2 = anon_unknown_14::operator<<(poVar2,&local_48);
    std::operator<<(poVar2,'\"');
    XmlEncode::~XmlEncode(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }